

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_waveform_generation.cc
# Opt level: O1

bool __thiscall
sptk::PeriodicWaveformGeneration::Get
          (PeriodicWaveformGeneration *this,double *sin,double *cos,double *sawtooth,double *pitch)

{
  double dVar1;
  InputSourceInterpolationWithMagicNumber *pIVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double in_XMM1_Qa;
  vector<double,_std::allocator<double>_> tmp;
  
  if (this->is_valid_ == true) {
    iVar3 = (*(this->input_source_->super_InputSourceInterface)._vptr_InputSourceInterface[4])();
    if (((char)iVar3 == '\0') || (in_XMM1_Qa = dRam0000000000000000, dRam0000000000000000 < 0.0)) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
    }
    if (bVar4 != false) {
      pIVar2 = this->input_source_;
      dVar1 = pIVar2->magic_number_;
      dVar7 = in_XMM1_Qa;
      if (this->strict_ == false) {
        if (((dVar1 == in_XMM1_Qa) && (!NAN(dVar1) && !NAN(in_XMM1_Qa))) &&
           (this->extending_ == true)) {
          dVar7 = this->voiced_pitch_;
        }
      }
      if (pitch != (double *)0x0) {
        *pitch = dVar7;
      }
      dVar6 = pIVar2->magic_number_;
      if ((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) {
        if (sin != (double *)0x0) {
          dVar6 = ::sin(this->phase_);
          *sin = dVar6;
        }
        if (cos != (double *)0x0) {
          dVar6 = ::cos(this->phase_);
          *cos = dVar6;
        }
        if (sawtooth != (double *)0x0) {
          *sawtooth = this->phase_ / 3.141592653589793 + -1.0;
        }
        bVar5 = this->strict_ == false;
        if (bVar5) {
          this->extending_ = true;
          this->voiced_pitch_ = dVar7;
        }
        dVar6 = this->phase_;
        dVar7 = 6.283185307179586 / dVar7 + dVar6;
        this->phase_ = dVar7;
        if ((bVar5 && in_XMM1_Qa == dVar1) &&
           (((dVar6 <= 3.141592653589793 && (3.141592653589793 <= dVar7)) ||
            ((dVar6 <= 6.283185307179586 && (6.283185307179586 <= dVar7)))))) {
          this->extending_ = false;
        }
        if (6.283185307179586 < dVar7) {
          this->phase_ = dVar7 + -6.283185307179586;
        }
      }
      else {
        this->phase_ = 0.0;
        if (sin != (double *)0x0) {
          *sin = this->unvoiced_value_;
        }
        if (cos != (double *)0x0) {
          *cos = this->unvoiced_value_;
        }
        if (sawtooth != (double *)0x0) {
          *sawtooth = this->unvoiced_value_;
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool PeriodicWaveformGeneration::Get(double* sin, double* cos, double* sawtooth,
                                     double* pitch) {
  if (!is_valid_) {
    return false;
  }

  // Get pitch.
  double pitch_in_current_point;
  {
    std::vector<double> tmp;
    if (!input_source_->Get(&tmp) || tmp[0] < 0.0) {
      return false;
    }
    pitch_in_current_point = tmp[0];
  }

  const bool unvoiced(input_source_->GetMagicNumber() ==
                      pitch_in_current_point);
  if (!strict_ && unvoiced && extending_) {
    pitch_in_current_point = voiced_pitch_;
  }

  if (pitch) {
    *pitch = pitch_in_current_point;
  }

  // If unvoiced point, return zero.
  if (input_source_->GetMagicNumber() == pitch_in_current_point) {
    phase_ = 0.0;
    if (sin) {
      *sin = unvoiced_value_;
    }
    if (cos) {
      *cos = unvoiced_value_;
    }
    if (sawtooth) {
      *sawtooth = unvoiced_value_;
    }
    return true;
  }

  if (sin) {
    *sin = std::sin(phase_);
  }
  if (cos) {
    *cos = std::cos(phase_);
  }
  if (sawtooth) {
    *sawtooth = phase_ / sptk::kPi - 1.0;
  }

  if (!strict_) {
    extending_ = true;
    voiced_pitch_ = pitch_in_current_point;
  }

  // Proceed phase.
  const double prev_phase(phase_);
  phase_ += sptk::kTwoPi / pitch_in_current_point;
  if (!strict_ && unvoiced &&
      ((prev_phase <= sptk::kPi && sptk::kPi <= phase_) ||
       (prev_phase <= sptk::kTwoPi && sptk::kTwoPi <= phase_))) {
    extending_ = false;
  }
  if (sptk::kTwoPi < phase_) {
    phase_ -= sptk::kTwoPi;
  }

  return true;
}